

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

iterator __thiscall Character::DelItem(Character *this,iterator it,int amount)

{
  int iVar1;
  iterator iVar2;
  
  if (amount < 1) {
    iVar2._M_node = (it._M_node)->_M_next;
  }
  else {
    iVar1 = *(int *)((long)&it._M_node[1]._M_next + 4);
    if ((iVar1 < 0) || (iVar1 - amount == 0 || iVar1 < amount)) {
      iVar2 = std::__cxx11::list<Character_Item,_std::allocator<Character_Item>_>::erase
                        (&this->inventory,it._M_node);
    }
    else {
      *(int *)((long)&it._M_node[1]._M_next + 4) = iVar1 - amount;
      iVar2._M_node = (it._M_node)->_M_next;
    }
    CalculateStats(this,true);
  }
  return (iterator)iVar2._M_node;
}

Assistant:

std::list<Character_Item>::iterator Character::DelItem(std::list<Character_Item>::iterator it, int amount)
{
	if (amount <= 0)
	{
		return ++it;
	}

	if (it->amount < 0 || it->amount - amount <= 0)
	{
		it = this->inventory.erase(it);
	}
	else
	{
		it->amount -= amount;
		++it;
	}

	this->CalculateStats();

	return it;
}